

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)34,(moira::Mode)6,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Ea<(moira::Mode)6,_(moira::Size)1> local_3c;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])();
  Op<(moira::Mode)6,(moira::Size)1>(&local_3c,this,op & 7,addr);
  pcVar5 = "btst";
  if (str->upper != false) {
    pcVar5 = "BTST";
  }
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar2 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar2) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  str->ptr = pcVar5 + 1;
  *pcVar5 = '#';
  StrWriter::operator<<(str,(UInt)(uVar4 & 0xff));
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ' ';
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}